

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O3

int next_cache_entry(archive_read *a,iso9660 *iso9660,file_info **pfile)

{
  heap_queue *heap;
  int *piVar1;
  anon_struct_16_2_ec647c9d_for_re_files *paVar2;
  anon_struct_16_2_ec647c9d_for_rede_files *paVar3;
  file_info ***pppfVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  uint uVar7;
  uint uVar8;
  file_info *pfVar9;
  file_info *pfVar10;
  void *pvVar11;
  uint64_t uVar12;
  ulong uVar13;
  file_info **ppfVar14;
  long lVar15;
  undefined8 uVar16;
  byte bVar17;
  file_info *pfVar18;
  uint64_t uVar19;
  byte *isodirrec;
  file_info *pfVar20;
  content *pcVar21;
  size_t sVar22;
  void *pvVar23;
  long *plVar24;
  long lVar25;
  ulong uVar26;
  file_info ***pppfVar27;
  uchar *p;
  char *fmt;
  byte *pbVar28;
  uint uVar29;
  file_info **ppfVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  ulong uVar35;
  int iVar36;
  size_t sVar37;
  anon_struct_16_2_ec647c9d_for_cache_files *paVar38;
  bool bVar39;
  anon_struct_16_2_ec647c9d empty_files;
  file_info *local_a0;
  file_info *local_68;
  file_info **appfStack_60 [2];
  anon_struct_16_2_ec647c9d_for_cache_files *local_50;
  heap_queue *local_48;
  long local_40;
  size_t local_38;
  
  do {
    paVar38 = &iso9660->cache_files;
    pfVar18 = (iso9660->cache_files).first;
    if (pfVar18 != (file_info *)0x0) {
      pfVar20 = pfVar18->next;
      paVar38->first = pfVar20;
      if (pfVar20 == (file_info *)0x0) {
        (iso9660->cache_files).last = &paVar38->first;
      }
      *pfile = pfVar18;
      uVar26 = 0;
      goto LAB_00125d65;
    }
    heap = &iso9660->pending_files;
    pfVar18 = heap_get_entry(heap);
    *pfile = pfVar18;
    if (pfVar18 != (file_info *)0x0) {
      paVar2 = &iso9660->re_files;
LAB_00125da1:
      uVar19 = pfVar18->cl_offset;
      if (uVar19 == 0) {
        if ((pfVar18->mode & 0xf000) != 0x4000) goto LAB_001265d5;
        pvVar11 = a->format->data;
        local_50 = paVar38;
        if (*(long *)((long)pvVar11 + 0xe0) != 0) {
          __archive_read_consume(a,*(long *)((long)pvVar11 + 0xe0));
          *(undefined8 *)((long)pvVar11 + 0xe0) = 0;
        }
        uVar26 = *(ulong *)((long)pvVar11 + 0xa0);
        uVar35 = pfVar18->offset;
        if (uVar35 < uVar26) {
          archive_set_error(&a->archive,-1,"Ignoring out-of-order directory (%s) %jd > %jd",
                            (pfVar18->name).s);
LAB_0012657a:
          uVar26 = 0xffffffec;
          goto LAB_00125d65;
        }
        uVar19 = pfVar18->size;
        if (*(ulong *)((long)pvVar11 + 0xb0) < uVar19 + uVar35) {
          archive_set_error(&a->archive,-1,"Directory is beyond end-of-media: %s",(pfVar18->name).s)
          ;
          goto LAB_0012657a;
        }
        if (uVar35 < uVar26 || uVar35 - uVar26 == 0) {
LAB_00125ea6:
          uVar26 = (*(ulong *)((long)pvVar11 + 0xa8) + uVar19) - 1;
          sVar37 = uVar26 - uVar26 % *(ulong *)((long)pvVar11 + 0xa8);
          isodirrec = (byte *)__archive_read_ahead(a,sVar37,(ssize_t *)0x0);
          if (isodirrec != (byte *)0x0) {
            *(long *)((long)pvVar11 + 0xa0) = *(long *)((long)pvVar11 + 0xa0) + sVar37;
            if (sVar37 != 0) {
              local_48 = (heap_queue *)((long)pvVar11 + 0x70);
              local_a0 = (file_info *)0x0;
              sVar22 = sVar37;
              do {
                local_40 = *(long *)((long)pvVar11 + 0xa8);
                pbVar28 = isodirrec + local_40;
                bVar17 = *isodirrec;
                local_38 = sVar22;
                for (; ((bVar17 != 0 && (isodirrec + 0x21 < pbVar28)) &&
                       (isodirrec + bVar17 <= pbVar28)); isodirrec = isodirrec + *isodirrec) {
                  if ((isodirrec[0x20] != 1) || (1 < isodirrec[0x21])) {
                    pfVar20 = parse_file_info(a,pfVar18,isodirrec,(long)pbVar28 - (long)isodirrec);
                    if (pfVar20 == (file_info *)0x0) {
LAB_001264e1:
                      __archive_read_consume(a,sVar37);
                      goto LAB_00126534;
                    }
                    if ((pfVar20->cl_offset == 0) &&
                       ((iVar36 = pfVar20->multi_extent, iVar36 != 0 ||
                        (local_a0 != (file_info *)0x0)))) {
                      if (local_a0 == (file_info *)0x0) {
                        (pfVar20->contents).first = (content *)0x0;
                        (pfVar20->contents).last = &(pfVar20->contents).first;
                        local_a0 = pfVar20;
                      }
                      pcVar21 = (content *)malloc(0x18);
                      if (pcVar21 == (content *)0x0) {
                        archive_set_error(&a->archive,0xc,"No memory for multi extent");
                        goto LAB_001264e1;
                      }
                      uVar19 = pfVar20->offset;
                      pcVar21->offset = uVar19;
                      uVar12 = pfVar20->size;
                      pcVar21->size = uVar12;
                      pcVar21->next = (content *)0x0;
                      *(local_a0->contents).last = pcVar21;
                      (local_a0->contents).last = &pcVar21->next;
                      if (local_a0 != pfVar20) {
                        local_a0->size = local_a0->size + uVar12;
                        if (iVar36 == 0) {
                          local_a0 = (file_info *)0x0;
                        }
                        goto LAB_00125fba;
                      }
                    }
                    else {
                      uVar19 = pfVar20->offset;
                    }
                    iVar36 = heap_add_entry(a,local_48,pfVar20,uVar19);
                    if (iVar36 != 0) goto LAB_00126534;
                  }
LAB_00125fba:
                  bVar17 = isodirrec[*isodirrec];
                }
                sVar22 = local_38 - local_40;
                isodirrec = pbVar28;
              } while (sVar22 != 0);
            }
            __archive_read_consume(a,sVar37);
            if (*(int *)((long)pvVar11 + 0x40) != 0) {
              sVar37 = *(size_t *)((long)pvVar11 + 0xa8);
              lVar25 = *(long *)((long)pvVar11 + 0xa0);
              do {
                if (**(long **)((long)pvVar11 + 0x38) != lVar25) break;
                pvVar23 = __archive_read_ahead(a,sVar37,(ssize_t *)0x0);
                if (pvVar23 == (void *)0x0) goto LAB_0012651e;
                plVar24 = *(long **)((long)pvVar11 + 0x38);
                do {
                  pfVar20 = (file_info *)plVar24[1];
                  uVar7 = pfVar20->ce_offset;
                  uVar8 = pfVar20->ce_size;
                  if (sVar37 < uVar8 + uVar7) {
                    fmt = "Malformed CE information";
                    iVar36 = 0x54;
                    goto LAB_0012652d;
                  }
                  if (0 < *(int *)((long)pvVar11 + 0x40)) {
                    uVar29 = *(int *)((long)pvVar11 + 0x40) - 1;
                    *(uint *)((long)pvVar11 + 0x40) = uVar29;
                    lVar25 = (plVar24 + (ulong)uVar29 * 2)[1];
                    *plVar24 = plVar24[(ulong)uVar29 * 2];
                    plVar24[1] = lVar25;
                    iVar36 = *(int *)((long)pvVar11 + 0x40);
                    if (1 < iVar36) {
                      uVar26 = **(ulong **)((long)pvVar11 + 0x38);
                      iVar33 = 0;
                      iVar32 = 1;
                      iVar34 = 0;
                      do {
                        lVar25 = *(long *)((long)pvVar11 + 0x38);
                        uVar35 = *(ulong *)(lVar25 + (long)iVar32 * 0x10);
                        iVar33 = iVar33 + 2;
                        iVar31 = iVar32;
                        if ((iVar33 < iVar36) &&
                           (uVar13 = *(ulong *)(lVar25 + (long)iVar33 * 0x10), uVar13 < uVar35)) {
                          uVar35 = uVar13;
                          iVar31 = iVar33;
                        }
                        if (uVar26 <= uVar35) break;
                        puVar5 = (undefined8 *)(lVar25 + (long)iVar34 * 0x10);
                        local_68 = (file_info *)*puVar5;
                        appfStack_60[0] = (file_info **)puVar5[1];
                        iVar32 = iVar31 * 2 + 1;
                        puVar5 = (undefined8 *)(lVar25 + (long)iVar31 * 0x10);
                        uVar16 = puVar5[1];
                        puVar6 = (undefined8 *)(lVar25 + (long)iVar34 * 0x10);
                        *puVar6 = *puVar5;
                        puVar6[1] = uVar16;
                        puVar5 = (undefined8 *)
                                 (*(long *)((long)pvVar11 + 0x38) + (long)iVar31 * 0x10);
                        *puVar5 = local_68;
                        puVar5[1] = appfStack_60[0];
                        iVar33 = iVar31 * 2;
                        iVar36 = *(int *)((long)pvVar11 + 0x40);
                        iVar34 = iVar31;
                      } while (iVar32 < iVar36);
                    }
                  }
                  p = (uchar *)((ulong)uVar7 + (long)pvVar23);
                  iVar36 = parse_rockridge(a,pfVar20,p,p + uVar8);
                  if (iVar36 != 0) goto LAB_00126534;
                } while ((*(int *)((long)pvVar11 + 0x40) != 0) &&
                        (plVar24 = *(long **)((long)pvVar11 + 0x38),
                        *plVar24 == *(long *)((long)pvVar11 + 0xa0)));
                __archive_read_consume(a,sVar37);
                lVar25 = *(long *)((long)pvVar11 + 0xa0) + sVar37;
                *(long *)((long)pvVar11 + 0xa0) = lVar25;
              } while (*(int *)((long)pvVar11 + 0x40) != 0);
            }
            goto LAB_001262f9;
          }
LAB_0012651e:
          fmt = "Failed to read full block when scanning ISO9660 directory list";
          iVar36 = -1;
LAB_0012652d:
          archive_set_error(&a->archive,iVar36,fmt);
          goto LAB_00126534;
        }
        uVar26 = __archive_read_consume(a,uVar35 - uVar26);
        if (-1 < (long)uVar26) {
          *(uint64_t *)((long)pvVar11 + 0xa0) = pfVar18->offset;
          uVar19 = pfVar18->size;
          goto LAB_00125ea6;
        }
        if ((int)uVar26 != 0) goto LAB_00125d65;
LAB_001262f9:
        paVar38 = local_50;
        if (pfVar18->rr_moved == '\0') {
          if (pfVar18->re == '\0') {
            pfVar20 = pfVar18;
            if (pfVar18->re_descendant != '\0') {
              do {
                pfVar20 = pfVar20->parent;
                if (pfVar20 == (file_info *)0x0) goto LAB_001265d5;
              } while (pfVar20->re == '\0');
              pfVar18->re_next = (file_info *)0x0;
              *(pfVar20->rede_files).last = pfVar18;
              (pfVar20->rede_files).last = &pfVar18->re_next;
              goto LAB_00126386;
            }
            goto LAB_001265d5;
          }
          pfVar18->re_next = (file_info *)0x0;
          *(iso9660->re_files).last = pfVar18;
          (iso9660->re_files).last = &pfVar18->re_next;
        }
        else if (pfVar18->rr_moved_has_re_only == '\0') goto LAB_001265d5;
      }
      else {
        pfVar20 = (file_info *)0x0;
        while( true ) {
          pfVar9 = paVar2->first;
          if ((pfVar9 != (file_info *)0x0) &&
             (pfVar10 = pfVar9->re_next, paVar2->first = pfVar10, pfVar10 == (file_info *)0x0)) {
            (iso9660->re_files).last = &paVar2->first;
          }
          if (pfVar9 == pfVar20) goto LAB_001265d5;
          if (pfVar9->offset == uVar19) break;
          if (pfVar20 == (file_info *)0x0) {
            pfVar20 = pfVar9;
          }
          pfVar9->re_next = (file_info *)0x0;
          *(iso9660->re_files).last = pfVar9;
          (iso9660->re_files).last = &pfVar9->re_next;
        }
        piVar1 = &pfVar9->parent->subdirs;
        *piVar1 = *piVar1 + -1;
        pfVar18 = pfVar18->parent;
        pfVar9->parent = pfVar18;
        pfVar9->re = '\0';
        if (pfVar18->re_descendant == '\0') goto LAB_00126584;
        pfVar9->re_descendant = '\x01';
        pfVar18 = pfVar9;
        do {
          pfVar18 = pfVar18->parent;
          if (pfVar18 == (file_info *)0x0) goto LAB_001264b3;
        } while (pfVar18->re == '\0');
        pfVar9->re_next = (file_info *)0x0;
        *(pfVar18->rede_files).last = pfVar9;
        (pfVar18->rede_files).last = &pfVar9->re_next;
        pfVar18 = (pfVar9->rede_files).first;
        if (pfVar18 != (file_info *)0x0) {
          paVar3 = &pfVar9->rede_files;
          do {
            pfVar20 = pfVar18->re_next;
            paVar3->first = pfVar20;
            if (pfVar20 == (file_info *)0x0) {
              (pfVar9->rede_files).last = &paVar3->first;
            }
            pfVar20 = pfVar18;
            do {
              pfVar20 = pfVar20->parent;
              if (pfVar20 == (file_info *)0x0) goto LAB_001264b3;
            } while (pfVar20->re == '\0');
            pfVar18->re_next = (file_info *)0x0;
            *(pfVar20->rede_files).last = pfVar18;
            (pfVar20->rede_files).last = &pfVar18->re_next;
            pfVar18 = paVar3->first;
          } while (pfVar18 != (file_info *)0x0);
        }
      }
LAB_00126386:
      pfVar18 = heap_get_entry(heap);
      *pfile = pfVar18;
      if (pfVar18 == (file_info *)0x0) goto LAB_0012639f;
      goto LAB_00125da1;
    }
LAB_0012639f:
    pfVar18 = (iso9660->re_files).first;
    if (pfVar18 != (file_info *)0x0) {
      pfVar20 = iso9660->rr_moved;
      if ((pfVar20 != (file_info *)0x0) && (pfVar20->rr_moved_has_re_only != '\0')) {
        pfVar20->next = (file_info *)0x0;
        *(iso9660->cache_files).last = pfVar20;
        (iso9660->cache_files).last = &pfVar20->next;
        pfVar18 = (iso9660->re_files).first;
        if (pfVar18 == (file_info *)0x0) goto LAB_00126491;
      }
      paVar2 = &iso9660->re_files;
      do {
        pfVar20 = pfVar18->re_next;
        paVar2->first = pfVar20;
        if (pfVar20 == (file_info *)0x0) {
          (iso9660->re_files).last = &paVar2->first;
        }
        pfVar9 = (pfVar18->rede_files).first;
        if (pfVar9 != (file_info *)0x0) {
          paVar3 = &pfVar18->rede_files;
          pfVar20 = pfVar9->re_next;
          paVar3->first = pfVar20;
          if (pfVar20 == (file_info *)0x0) {
            (pfVar18->rede_files).last = &paVar3->first;
          }
          ppfVar14 = (iso9660->cache_files).last;
          ppfVar30 = &pfVar9->next;
          pfVar9->next = (file_info *)0x0;
          *ppfVar14 = pfVar9;
          (iso9660->cache_files).last = ppfVar30;
          pfVar20 = (pfVar18->rede_files).first;
          while (pfVar20 != (file_info *)0x0) {
            pfVar9 = pfVar20->re_next;
            paVar3->first = pfVar9;
            if (pfVar9 == (file_info *)0x0) {
              (pfVar18->rede_files).last = &paVar3->first;
            }
            pfVar20->next = (file_info *)0x0;
            *ppfVar30 = pfVar20;
            ppfVar30 = &pfVar20->next;
            (iso9660->cache_files).last = ppfVar30;
            pfVar20 = paVar3->first;
          }
          pfVar20 = paVar2->first;
        }
        pfVar18 = pfVar20;
      } while (pfVar18 != (file_info *)0x0);
    }
LAB_00126491:
  } while (paVar38->first != (file_info *)0x0);
  uVar26 = 1;
LAB_00125d65:
  return (int)uVar26;
LAB_00126584:
  *pfile = pfVar9;
  pfVar20 = (pfVar9->rede_files).first;
  pfVar18 = pfVar9;
  if (pfVar20 != (file_info *)0x0) {
    paVar3 = &pfVar9->rede_files;
    do {
      pfVar10 = pfVar20->re_next;
      paVar3->first = pfVar10;
      if (pfVar10 == (file_info *)0x0) {
        (pfVar9->rede_files).last = &paVar3->first;
      }
      pfVar20->next = (file_info *)0x0;
      *(iso9660->cache_files).last = pfVar20;
      (iso9660->cache_files).last = &pfVar20->next;
      pfVar20 = paVar3->first;
    } while (pfVar20 != (file_info *)0x0);
  }
LAB_001265d5:
  uVar26 = 0;
  if (((pfVar18->mode & 0xf000) == 0x8000) && (lVar25 = pfVar18->number, lVar25 != -1)) {
    iVar36 = 0;
    (iso9660->cache_files).first = (file_info *)0x0;
    (iso9660->cache_files).last = &paVar38->first;
    local_68 = (file_info *)0x0;
    appfStack_60[0] = &local_68;
    if (0 < (iso9660->pending_files).used) {
      pppfVar4 = &(iso9660->cache_files).last;
      do {
        lVar15 = (*heap->files)->number;
        if ((lVar15 != -1) && (lVar15 != lVar25)) break;
        bVar39 = pfVar18->number != -1;
        pppfVar27 = pppfVar4;
        if (!bVar39) {
          pppfVar27 = appfStack_60;
        }
        iVar36 = iVar36 + (uint)bVar39;
        pfVar18->next = (file_info *)0x0;
        **pppfVar27 = pfVar18;
        *pppfVar27 = &pfVar18->next;
        pfVar18 = heap_get_entry(heap);
      } while (0 < (iso9660->pending_files).used);
      if (iVar36 != 0) {
        bVar39 = pfVar18->number != -1;
        pppfVar27 = appfStack_60;
        if (bVar39) {
          pppfVar27 = pppfVar4;
        }
        iVar36 = iVar36 + (uint)bVar39;
        pfVar18->next = (file_info *)0x0;
        **pppfVar27 = pfVar18;
        *pppfVar27 = &pfVar18->next;
        if (1 < iVar36) {
          for (pfVar18 = paVar38->first; pfVar18 != (file_info *)0x0; pfVar18 = pfVar18->next) {
            pfVar18->nlinks = iVar36;
          }
        }
        if (local_68 != (file_info *)0x0) {
          **pppfVar4 = local_68;
          *pppfVar4 = appfStack_60[0];
        }
        pfVar18 = paVar38->first;
        if ((pfVar18 != (file_info *)0x0) &&
           (pfVar20 = pfVar18->next, paVar38->first = pfVar20, pfVar20 == (file_info *)0x0)) {
          *pppfVar4 = &paVar38->first;
        }
        uVar26 = (ulong)(pfVar18 == (file_info *)0x0);
        *pfile = pfVar18;
        goto LAB_00125d65;
      }
    }
    *pfile = pfVar18;
    uVar26 = (ulong)(pfVar18 == (file_info *)0x0);
  }
  goto LAB_00125d65;
LAB_001264b3:
  archive_set_error(&a->archive,-1,
                    "Failed to connect \'CL\' pointer to \'RE\' rr_moved pointer of Rockridge extensions: current position = %jd, CL offset = %jd"
                    ,iso9660->current_position);
LAB_00126534:
  uVar26 = 0xffffffe2;
  goto LAB_00125d65;
}

Assistant:

static int
next_cache_entry(struct archive_read *a, struct iso9660 *iso9660,
    struct file_info **pfile)
{
	struct file_info *file;
	struct {
		struct file_info	*first;
		struct file_info	**last;
	}	empty_files;
	int64_t number;
	int count;

	file = cache_get_entry(iso9660);
	if (file != NULL) {
		*pfile = file;
		return (ARCHIVE_OK);
	}

	for (;;) {
		struct file_info *re, *d;

		*pfile = file = next_entry(iso9660);
		if (file == NULL) {
			/*
			 * If directory entries all which are descendant of
			 * rr_moved are still remaining, expose their.
			 */
			if (iso9660->re_files.first != NULL &&
			    iso9660->rr_moved != NULL &&
			    iso9660->rr_moved->rr_moved_has_re_only)
				/* Expose "rr_moved" entry. */
				cache_add_entry(iso9660, iso9660->rr_moved);
			while ((re = re_get_entry(iso9660)) != NULL) {
				/* Expose its descendant dirs. */
				while ((d = rede_get_entry(re)) != NULL)
					cache_add_entry(iso9660, d);
			}
			if (iso9660->cache_files.first != NULL)
				return (next_cache_entry(a, iso9660, pfile));
			return (ARCHIVE_EOF);
		}

		if (file->cl_offset) {
			struct file_info *first_re = NULL;
			int nexted_re = 0;

			/*
			 * Find "RE" dir for the current file, which
			 * has "CL" flag.
			 */
			while ((re = re_get_entry(iso9660))
			    != first_re) {
				if (first_re == NULL)
					first_re = re;
				if (re->offset == file->cl_offset) {
					re->parent->subdirs--;
					re->parent = file->parent;
					re->re = 0;
					if (re->parent->re_descendant) {
						nexted_re = 1;
						re->re_descendant = 1;
						if (rede_add_entry(re) < 0)
							goto fatal_rr;
						/* Move a list of descendants
						 * to a new ancestor. */
						while ((d = rede_get_entry(
						    re)) != NULL)
							if (rede_add_entry(d)
							    < 0)
								goto fatal_rr;
						break;
					}
					/* Replace the current file
					 * with "RE" dir */
					*pfile = file = re;
					/* Expose its descendant */
					while ((d = rede_get_entry(
					    file)) != NULL)
						cache_add_entry(
						    iso9660, d);
					break;
				} else
					re_add_entry(iso9660, re);
			}
			if (nexted_re) {
				/*
				 * Do not expose this at this time
				 * because we have not gotten its full-path
				 * name yet.
				 */
				continue;
			}
		} else if ((file->mode & AE_IFMT) == AE_IFDIR) {
			int r;

			/* Read file entries in this dir. */
			r = read_children(a, file);
			if (r != ARCHIVE_OK)
				return (r);

			/*
			 * Handle a special dir of Rockridge extensions,
			 * "rr_moved".
			 */
			if (file->rr_moved) {
				/*
				 * If this has only the subdirectories which
				 * have "RE" flags, do not expose at this time.
				 */
				if (file->rr_moved_has_re_only)
					continue;
				/* Otherwise expose "rr_moved" entry. */
			} else if (file->re) {
				/*
				 * Do not expose this at this time
				 * because we have not gotten its full-path
				 * name yet.
				 */
				re_add_entry(iso9660, file);
				continue;
			} else if (file->re_descendant) {
				/*
				 * If the top level "RE" entry of this entry
				 * is not exposed, we, accordingly, should not
				 * expose this entry at this time because
				 * we cannot make its proper full-path name.
				 */
				if (rede_add_entry(file) == 0)
					continue;
				/* Otherwise we can expose this entry because
				 * it seems its top level "RE" has already been
				 * exposed. */
			}
		}
		break;
	}

	if ((file->mode & AE_IFMT) != AE_IFREG || file->number == -1)
		return (ARCHIVE_OK);

	count = 0;
	number = file->number;
	iso9660->cache_files.first = NULL;
	iso9660->cache_files.last = &(iso9660->cache_files.first);
	empty_files.first = NULL;
	empty_files.last = &empty_files.first;
	/* Collect files which has the same file serial number.
	 * Peek pending_files so that file which number is different
	 * is not put back. */
	while (iso9660->pending_files.used > 0 &&
	    (iso9660->pending_files.files[0]->number == -1 ||
	     iso9660->pending_files.files[0]->number == number)) {
		if (file->number == -1) {
			/* This file has the same offset
			 * but it's wrong offset which empty files
			 * and symlink files have.
			 * NOTE: This wrong offset was recorded by
			 * old mkisofs utility. If ISO images is
			 * created by latest mkisofs, this does not
			 * happen.
			 */
			file->next = NULL;
			*empty_files.last = file;
			empty_files.last = &(file->next);
		} else {
			count++;
			cache_add_entry(iso9660, file);
		}
		file = next_entry(iso9660);
	}

	if (count == 0) {
		*pfile = file;
		return ((file == NULL)?ARCHIVE_EOF:ARCHIVE_OK);
	}
	if (file->number == -1) {
		file->next = NULL;
		*empty_files.last = file;
		empty_files.last = &(file->next);
	} else {
		count++;
		cache_add_entry(iso9660, file);
	}

	if (count > 1) {
		/* The count is the same as number of hardlink,
		 * so much so that each nlinks of files in cache_file
		 * is overwritten by value of the count.
		 */
		for (file = iso9660->cache_files.first;
		    file != NULL; file = file->next)
			file->nlinks = count;
	}
	/* If there are empty files, that files are added
	 * to the tail of the cache_files. */
	if (empty_files.first != NULL) {
		*iso9660->cache_files.last = empty_files.first;
		iso9660->cache_files.last = empty_files.last;
	}
	*pfile = cache_get_entry(iso9660);
	return ((*pfile == NULL)?ARCHIVE_EOF:ARCHIVE_OK);

fatal_rr:
	archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
	    "Failed to connect 'CL' pointer to 'RE' rr_moved pointer of "
	    "Rockridge extensions: current position = %jd, CL offset = %jd",
	    (intmax_t)iso9660->current_position, (intmax_t)file->cl_offset);
	return (ARCHIVE_FATAL);
}